

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeType.cpp
# Opt level: O3

timeType __thiscall sjtu::timeType::operator+(timeType *this,int *time)

{
  int iVar1;
  int iVar2;
  int *in_RDX;
  ulong uVar3;
  uint *puVar4;
  int iVar5;
  timeType *ret;
  uint uVar6;
  timeType tVar7;
  
  iVar1 = (*in_RDX + time[3]) / 0x3c + time[2];
  this->minute = (*in_RDX + time[3]) % 0x3c;
  uVar6 = iVar1 / 0x18;
  uVar3 = (ulong)uVar6;
  this->hour = iVar1 % 0x18;
  iVar1 = *time;
  iVar2 = time[1];
  iVar5 = iVar2 + uVar6;
  uVar6 = *(uint *)(months + (long)iVar1 * 4);
  if ((int)uVar6 < iVar5) {
    puVar4 = (uint *)(months + (long)iVar1 * 4);
    do {
      puVar4 = puVar4 + 1;
      iVar2 = (int)uVar3 + iVar2;
      iVar5 = iVar2 - uVar6;
      uVar3 = (ulong)(~uVar6 + iVar2);
      uVar6 = *puVar4;
      iVar1 = iVar1 + 1;
      iVar2 = 1;
    } while ((int)uVar6 < iVar5);
  }
  this->month = iVar1;
  this->day = iVar5;
  tVar7.hour = (int)uVar3;
  tVar7.minute = (int)(uVar3 >> 0x20);
  tVar7._0_8_ = this;
  return tVar7;
}

Assistant:

timeType timeType::operator+(const int &time) const {
        	timeType ret;
                ret.minute = minute + time , ret.hour = hour + ret.minute / 60 , ret.minute %= 60;
                int day_add = ret.hour / 24;ret.hour %= 24;
                for (ret.day = day , ret.month = month;day_add + ret.day > months[ret.month];++ ret.month) day_add -= months[ret.month] - ret.day + 1 , ret.day = 1;
                ret.day += day_add;
        	return ret;
        }